

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rms.c
# Opt level: O0

int deleteFiles(char *directory)

{
  undefined8 uVar1;
  _Bool _Var2;
  size_t sVar3;
  DIR *__dirp;
  char *__file;
  char *filepath;
  stat st;
  dirent *ent;
  DIR *dir;
  char dirpath [4096];
  char *directory_local;
  
  if ((directory == (char *)0x0) ||
     (dirpath._4088_8_ = directory, sVar3 = strlen(directory), sVar3 == 0)) {
    directory_local._4_4_ = 1;
  }
  else {
    _Var2 = isDirectory((char *)dirpath._4088_8_);
    if (_Var2) {
      memset(&dir,0,0x1000);
      strcat((char *)&dir,(char *)dirpath._4088_8_);
      uVar1 = dirpath._4088_8_;
      sVar3 = strlen((char *)dirpath._4088_8_);
      if (*(char *)(uVar1 + (sVar3 - 1)) != '/') {
        strcat((char *)&dir,"/");
      }
      __dirp = opendir((char *)&dir);
      while (st.__glibc_reserved[2] = (__syscall_slong_t)readdir(__dirp),
            (dirent *)st.__glibc_reserved[2] != (dirent *)0x0) {
        __file = pathJoin((char *)&dir,((dirent *)st.__glibc_reserved[2])->d_name);
        lstat(__file,(stat *)&filepath);
        if (((uint)st.st_nlink & 0xf000) == 0x8000) {
          deleteFile(__file);
        }
        else if ((((uint)st.st_nlink & 0xf000) == 0x4000) &&
                (_Var2 = isDotDirectory((char *)(st.__glibc_reserved[2] + 0x13)), !_Var2)) {
          deleteFiles(__file);
        }
      }
      closedir(__dirp);
      rmdir((char *)&dir);
      directory_local._4_4_ = 0;
    }
    else {
      directory_local._4_4_ = deleteFile((char *)dirpath._4088_8_);
    }
  }
  return directory_local._4_4_;
}

Assistant:

int deleteFiles(const char *directory) {
  if (!directory || !strlen(directory))
    return 1;

  if (!isDirectory(directory))
    return deleteFile(directory);

  char dirpath[PATH_MAX] = {0};
  strcat(dirpath, directory);
  if (directory[strlen(directory) - 1] != '/')
    strcat(dirpath, "/");

  DIR *dir = opendir(dirpath);
  struct dirent *ent;
  while ((ent = readdir(dir))) {
    struct stat st;
    const char *filepath = pathJoin(dirpath, ent->d_name);
    lstat(filepath, &st);

    if (S_ISREG(st.st_mode))
      deleteFile(filepath);
    else if (S_ISDIR(st.st_mode) && !isDotDirectory(ent->d_name))
      deleteFiles(filepath);
  }
  closedir(dir);
  rmdir(dirpath);
  return 0;
}